

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::Suffix_Array
          (Suffix_Array<unsigned_long> *this,char *T,idx_t_conflict n,
          idx_t_conflict subproblem_count,idx_t_conflict max_context)

{
  unsigned_long *puVar1;
  unsigned_long in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  long local_68;
  idx_t_conflict *local_58;
  unsigned_long local_40;
  unsigned_long local_38;
  ulong local_30;
  long local_28;
  unsigned_long local_20;
  ulong local_18;
  undefined1 extraout_var [56];
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  puVar1 = allocate<unsigned_long>(0x1101b1);
  in_RDI[2] = puVar1;
  puVar1 = allocate<unsigned_long>(0x1101c6);
  in_RDI[3] = puVar1;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  if (local_20 == 0) {
    local_58 = &default_subproblem_count;
  }
  else {
    local_58 = &local_20;
  }
  local_30 = local_18 >> 4;
  puVar1 = std::min<unsigned_long>(local_58,&local_30);
  in_RDI[6] = *puVar1;
  if (local_28 == 0) {
    local_68 = in_RDI[1];
  }
  else {
    local_68 = local_28;
  }
  in_RDI[7] = local_68;
  in_RDI[8] = 0;
  auVar2._0_8_ = std::log<unsigned_long>(0x110288);
  auVar2._8_56_ = extraout_var;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = auVar2._0_8_ * 32.0;
  auVar3 = vroundsd_avx(auVar2._0_16_,auVar3,10);
  local_38 = vcvttsd2usi_avx512f(auVar3);
  local_40 = (ulong)in_RDI[1] / (ulong)in_RDI[6] - 1;
  puVar1 = std::min<unsigned_long>(&local_38,&local_40);
  in_RDI[9] = *puVar1;
  puVar1 = allocate<unsigned_long>(0x1102e8);
  in_RDI[10] = puVar1;
  puVar1 = allocate<unsigned_long>(0x110309);
  in_RDI[0xb] = puVar1;
  if ((ulong)in_RDI[1] < (ulong)in_RDI[6]) {
    std::operator<<((ostream *)&std::cerr,"Incompatible subproblem-count. Aborting.\n");
    exit(1);
  }
  return;
}

Assistant:

Suffix_Array<T_idx_>::Suffix_Array(const char* const T, const idx_t n, const idx_t subproblem_count, const idx_t max_context):
    T_(T),
    n_(n),
    SA_(allocate<idx_t>(n_)),
    LCP_(allocate<idx_t>(n_)),
    SA_w(nullptr),
    LCP_w(nullptr),
    p_(std::min(subproblem_count > 0 ? subproblem_count : default_subproblem_count, n / 16)),   // TODO: fix subproblem-count for small `n`.
    max_context(max_context ? max_context : n_),
    pivot_(nullptr),
    pivot_per_part_(std::min(static_cast<idx_t>(std::ceil(32.0 * std::log(n_))), n_ / p_ - 1)), // (c \ln n) or (|subarray| - 1)
    part_size_scan_(allocate<idx_t>(p_ + 1)),
    part_ruler_(allocate<idx_t>(p_ * (p_ + 1)))
{
    assert(n_ >= 16);   // TODO: fix subproblem-count for small `n`.

    if(p_ > n_)
    {
        std::cerr << "Incompatible subproblem-count. Aborting.\n";
        std::exit(EXIT_FAILURE);
    }
}